

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O3

string * CLI::detail::extract_binary_string(string *__return_storage_ptr__,string *escaped_string)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  sVar2 = escaped_string->_M_string_length;
  uVar9 = 3;
  iVar4 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x3);
  if (iVar4 == 0) {
    lVar7 = 2;
    iVar4 = ::std::__cxx11::string::compare((ulong)escaped_string,sVar2 - 2,(char *)0x2);
    if (iVar4 != 0) goto LAB_0012a008;
LAB_0012a074:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    for (; uVar9 < sVar2 - lVar7; uVar9 = uVar9 + lVar8) {
      pcVar3 = (escaped_string->_M_dataplus)._M_p;
      if ((pcVar3[uVar9] == '\\') && ((byte)(pcVar3[uVar9 + 1] | 0x20U) == 0x78)) {
        cVar1 = pcVar3[uVar9 + 2];
        iVar4 = (int)cVar1;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar5 = iVar4 - 0x30;
        }
        else if ((byte)(cVar1 + 0xbfU) < 6) {
          uVar5 = iVar4 - 0x37;
        }
        else if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar5 = iVar4 - 0x57;
        }
        else {
          uVar5 = 0xffffffff;
        }
        cVar1 = pcVar3[uVar9 + 3];
        iVar4 = (int)cVar1;
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar6 = iVar4 - 0x30;
        }
        else if ((byte)(cVar1 + 0xbfU) < 6) {
          uVar6 = iVar4 - 0x37;
        }
        else if ((byte)(cVar1 + 0x9fU) < 6) {
          uVar6 = iVar4 - 0x57;
        }
        else {
          uVar6 = 0xffffffff;
        }
        if (0xf < (uVar6 | uVar5)) goto LAB_0012a14b;
        lVar8 = 4;
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
LAB_0012a14b:
        lVar8 = 1;
        ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  else {
LAB_0012a008:
    uVar9 = 4;
    iVar4 = ::std::__cxx11::string::compare((ulong)escaped_string,0,(char *)0x4);
    if (iVar4 == 0) {
      lVar7 = 3;
      iVar4 = ::std::__cxx11::string::compare((ulong)escaped_string,sVar2 - 3,(char *)0x3);
      if (iVar4 == 0) goto LAB_0012a074;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (escaped_string->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + escaped_string->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string extract_binary_string(const std::string &escaped_string) {
    std::size_t start{0};
    std::size_t tail{0};
    size_t ssize = escaped_string.size();
    if(escaped_string.compare(0, 3, "B\"(") == 0 && escaped_string.compare(ssize - 2, 2, ")\"") == 0) {
        start = 3;
        tail = 2;
    } else if(escaped_string.compare(0, 4, "'B\"(") == 0 && escaped_string.compare(ssize - 3, 3, ")\"'") == 0) {
        start = 4;
        tail = 3;
    }

    if(start == 0) {
        return escaped_string;
    }
    std::string outstring;

    outstring.reserve(ssize - start - tail);
    std::size_t loc = start;
    while(loc < ssize - tail) {
        // ssize-2 to skip )" at the end
        if(escaped_string[loc] == '\\' && (escaped_string[loc + 1] == 'x' || escaped_string[loc + 1] == 'X')) {
            auto c1 = escaped_string[loc + 2];
            auto c2 = escaped_string[loc + 3];

            std::uint32_t res1 = hexConvert(c1);
            std::uint32_t res2 = hexConvert(c2);
            if(res1 <= 0x0F && res2 <= 0x0F) {
                loc += 4;
                outstring.push_back(static_cast<char>(res1 * 16 + res2));
                continue;
            }
        }
        outstring.push_back(escaped_string[loc]);
        ++loc;
    }
    return outstring;
}